

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O1

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  __s = *outputs;
  __s_00 = outputs[1];
  lVar6 = *(long *)((long)param + 0x20);
  if (lVar6 != 0) {
    if (samples != 0) {
      uVar7 = 0;
      do {
        lVar9 = 0;
        iVar8 = 0;
        do {
          if ((*(char *)((long)param + lVar9 + 0x65) == '\0') &&
             (*(char *)((long)param + lVar9 + 100) != '\0')) {
            iVar10 = (int)*(char *)((long)param + lVar9 + 0x66);
            if (*(char *)((long)param + 0xbc) == '\0') {
              iVar10 = (uint)*(ushort *)((long)param + lVar9 + 0x60) * iVar10;
            }
            else {
              iVar5 = *(int *)((long)param + lVar9 + 0x58);
              iVar10 = (int)((uint)*(ushort *)((long)param + lVar9 + 0x60) *
                            (*(char *)((long)param + lVar9 + 0x67) * iVar5 +
                            (0x10000 - iVar5) * iVar10)) >> 0x10;
            }
            piVar2 = (int *)((long)param + lVar9 + 0x58);
            *piVar2 = *piVar2 + *(int *)((long)param + lVar9 + 0x5c);
            iVar8 = iVar8 + iVar10;
            pcVar3 = (char *)((long)param + lVar9 + 99);
            *pcVar3 = *pcVar3 + '\x01';
            if (*pcVar3 == '\0') {
              iVar10 = *(int *)((long)param + lVar9 + 0x54);
              uVar1 = iVar10 + 1;
              *(uint *)((long)param + lVar9 + 0x54) = uVar1;
              *(undefined4 *)((long)param + lVar9 + 0x58) = 0;
              *(undefined1 *)((long)param + lVar9 + 99) =
                   *(undefined1 *)((long)param + lVar9 + 0x62);
              cVar4 = *(char *)(lVar6 + (ulong)uVar1);
              if (cVar4 == '\0') {
                *(undefined1 *)((long)param + lVar9 + 100) = 0;
              }
              else {
                *(char *)((long)param + lVar9 + 0x66) = cVar4 + -0x80;
              }
              cVar4 = *(char *)(lVar6 + (ulong)(iVar10 + 2));
              if (cVar4 != '\0') {
                *(char *)((long)param + lVar9 + 0x67) = cVar4 + -0x80;
              }
            }
          }
          lVar9 = lVar9 + 0x1c;
        } while (lVar9 != 0x70);
        __s[uVar7] = iVar8 >> 2;
        __s_00[uVar7] = iVar8 >> 2;
        uVar7 = uVar7 + 1;
      } while (uVar7 != samples);
    }
    return;
  }
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];
	if (chip->rom == NULL)
	{
		memset(outL, 0, samples * sizeof(DEV_SMPL));
		memset(outR, 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}